

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O2

int32_t __thiscall
icu_63::TimeZoneFormat::parseOffsetDefaultLocalizedGMT
          (TimeZoneFormat *this,UnicodeString *text,int start,int32_t *parsedLen)

{
  short sVar1;
  int8_t iVar2;
  char16_t cVar3;
  int32_t _length;
  int iVar4;
  int32_t iVar5;
  int iVar6;
  int32_t iVar7;
  int32_t iVar8;
  int start_00;
  long lVar9;
  int32_t lenAbut;
  int32_t lenWithSep;
  
  lVar9 = 0;
  do {
    if (lVar9 + 8 == 0x20) goto LAB_0020cbe6;
    _length = u_strlen_63((UChar *)(ALT_GMT_STRINGS + lVar9));
    iVar2 = UnicodeString::caseCompare(text,start,_length,(char16_t *)(ALT_GMT_STRINGS + lVar9),0);
    lVar9 = lVar9 + 8;
  } while (iVar2 != '\0');
  if (_length == 0) {
LAB_0020cbe6:
    iVar7 = 0;
    iVar8 = 0;
  }
  else {
    start_00 = _length + start + 1;
    sVar1 = (text->fUnion).fStackFields.fLengthAndFlags;
    iVar8 = 0;
    if (sVar1 < 0) {
      iVar4 = (text->fUnion).fFields.fLength;
    }
    else {
      iVar4 = (int)sVar1 >> 5;
    }
    if (start_00 < iVar4) {
      cVar3 = UnicodeString::doCharAt(text,start + _length);
      if (cVar3 == L'+') {
        iVar4 = 1;
      }
      else {
        iVar7 = 0;
        if (cVar3 != L'-') goto LAB_0020cbeb;
        iVar4 = -1;
      }
      lenWithSep = 0;
      iVar5 = parseDefaultOffsetFields(this,text,start_00,L':',&lenWithSep);
      iVar8 = lenWithSep;
      sVar1 = (text->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar6 = (text->fUnion).fFields.fLength;
      }
      else {
        iVar6 = (int)sVar1 >> 5;
      }
      lenAbut = iVar8;
      iVar7 = iVar5;
      if (lenWithSep != iVar6 - start_00) {
        lenAbut = 0;
        iVar7 = parseAbuttingOffsetFields(this,text,start_00,&lenAbut);
        if (lenAbut < iVar8) {
          lenAbut = iVar8;
          iVar7 = iVar5;
        }
      }
      iVar7 = iVar7 * iVar4;
      iVar8 = _length + lenAbut + 1;
    }
    else {
      iVar7 = 0;
    }
  }
LAB_0020cbeb:
  *parsedLen = iVar8;
  return iVar7;
}

Assistant:

int32_t
TimeZoneFormat::parseOffsetDefaultLocalizedGMT(const UnicodeString& text, int start, int32_t& parsedLen) const {
    int32_t idx = start;
    int32_t offset = 0;
    int32_t parsed = 0;

    do {
        // check global default GMT alternatives
        int32_t gmtLen = 0;

        for (int32_t i = 0; ALT_GMT_STRINGS[i][0] != 0; i++) {
            const UChar* gmt = ALT_GMT_STRINGS[i];
            int32_t len = u_strlen(gmt);
            if (text.caseCompare(start, len, gmt, 0) == 0) {
                gmtLen = len;
                break;
            }
        }
        if (gmtLen == 0) {
            break;
        }
        idx += gmtLen;

        // offset needs a sign char and a digit at minimum
        if (idx + 1 >= text.length()) {
            break;
        }

        // parse sign
        int32_t sign = 1;
        UChar c = text.charAt(idx);
        if (c == PLUS) {
            sign = 1;
        } else if (c == MINUS) {
            sign = -1;
        } else {
            break;
        }
        idx++;

        // offset part
        // try the default pattern with the separator first
        int32_t lenWithSep = 0;
        int32_t offsetWithSep = parseDefaultOffsetFields(text, idx, DEFAULT_GMT_OFFSET_SEP, lenWithSep);
        if (lenWithSep == text.length() - idx) {
            // maximum match
            offset = offsetWithSep * sign;
            idx += lenWithSep;
        } else {
            // try abutting field pattern
            int32_t lenAbut = 0;
            int32_t offsetAbut = parseAbuttingOffsetFields(text, idx, lenAbut);

            if (lenWithSep > lenAbut) {
                offset = offsetWithSep * sign;
                idx += lenWithSep;
            } else {
                offset = offsetAbut * sign;
                idx += lenAbut;
            }
        }
        parsed = idx - start;
    } while (false);

    parsedLen = parsed;
    return offset;
}